

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_textedit_discard_redo(StbUndoState *state)

{
  int iVar1;
  long lVar2;
  char *buf_end;
  char *buf_begin;
  size_t move_size;
  int i;
  int n;
  int k;
  StbUndoState *state_local;
  
  if (state->redo_point < 99) {
    if (-1 < state->undo_rec[0x62].char_storage) {
      iVar1 = state->undo_rec[0x62].insert_length;
      state->redo_char_point = iVar1 + state->redo_char_point;
      memmove(state->undo_char + state->redo_char_point,
              (void *)((long)state + (long)iVar1 * -2 + (long)state->redo_char_point * 2 + 0x630),
              (long)(999 - state->redo_char_point) << 1);
      for (move_size._4_4_ = (int)state->redo_point; move_size._4_4_ < 0x62;
          move_size._4_4_ = move_size._4_4_ + 1) {
        if (-1 < state->undo_rec[move_size._4_4_].char_storage) {
          state->undo_rec[move_size._4_4_].char_storage =
               iVar1 + state->undo_rec[move_size._4_4_].char_storage;
        }
      }
    }
    lVar2 = (long)(0x62 - state->redo_point);
    if ((StbUndoState *)(state->undo_rec + (int)state->redo_point) < state) {
      __assert_fail("((char*)(state->undo_rec + state->redo_point)) >= buf_begin",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imstb_textedit.h"
                    ,0x475,"void ImStb::stb_textedit_discard_redo(StbUndoState *)");
    }
    if (state->undo_char < state->undo_rec + (long)(int)state->redo_point + lVar2 + 1) {
      __assert_fail("((char*)(state->undo_rec + state->redo_point + 1) + move_size) <= buf_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imstb_textedit.h"
                    ,0x476,"void ImStb::stb_textedit_discard_redo(StbUndoState *)");
    }
    memmove(state->undo_rec + (long)(int)state->redo_point + 1,
            state->undo_rec + (int)state->redo_point,lVar2 * 0x10);
    state->redo_point = state->redo_point + 1;
  }
  return;
}

Assistant:

static void stb_textedit_discard_redo(StbUndoState *state)
{
   int k = STB_TEXTEDIT_UNDOSTATECOUNT-1;

   if (state->redo_point <= k) {
      // if the k'th undo state has characters, clean those up
      if (state->undo_rec[k].char_storage >= 0) {
         int n = state->undo_rec[k].insert_length, i;
         // move the remaining redo character data to the end of the buffer
         state->redo_char_point += n;
         STB_TEXTEDIT_memmove(state->undo_char + state->redo_char_point, state->undo_char + state->redo_char_point-n, (size_t) ((STB_TEXTEDIT_UNDOCHARCOUNT - state->redo_char_point)*sizeof(STB_TEXTEDIT_CHARTYPE)));
         // adjust the position of all the other records to account for above memmove
         for (i=state->redo_point; i < k; ++i)
            if (state->undo_rec[i].char_storage >= 0)
               state->undo_rec[i].char_storage += n;
      }
      // now move all the redo records towards the end of the buffer; the first one is at 'redo_point'
      // {DEAR IMGUI]
      size_t move_size = (size_t)((STB_TEXTEDIT_UNDOSTATECOUNT - state->redo_point - 1) * sizeof(state->undo_rec[0]));
      const char* buf_begin = (char*)state->undo_rec; (void)buf_begin;
      const char* buf_end   = (char*)state->undo_rec + sizeof(state->undo_rec); (void)buf_end;
      IM_ASSERT(((char*)(state->undo_rec + state->redo_point)) >= buf_begin);
      IM_ASSERT(((char*)(state->undo_rec + state->redo_point + 1) + move_size) <= buf_end);
      STB_TEXTEDIT_memmove(state->undo_rec + state->redo_point+1, state->undo_rec + state->redo_point, move_size);

      // now move redo_point to point to the new one
      ++state->redo_point;
   }
}